

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

Vector<const_char> __thiscall
FIX::double_conversion::Vector<const_char>::SubVector(Vector<const_char> *this,int from,int to)

{
  Vector<const_char> VVar1;
  undefined1 local_18 [12];
  
  if (this->length_ < to) {
    __assert_fail("to <= length_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xb9,
                  "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
                 );
  }
  if (to - from != 0 && from <= to) {
    if (-1 < from) {
      Vector((Vector<const_char> *)local_18,this->start_ + (uint)from,to - from);
      VVar1._12_4_ = 0;
      VVar1.start_ = (char *)local_18._0_8_;
      VVar1.length_ = local_18._8_4_;
      return VVar1;
    }
    __assert_fail("0 <= from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xbb,
                  "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
                 );
  }
  __assert_fail("from < to",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xba,
                "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
               );
}

Assistant:

Vector<T> SubVector(int from, int to) {
    ASSERT(to <= length_);
    ASSERT(from < to);
    ASSERT(0 <= from);
    return Vector<T>(start() + from, to - from);
  }